

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96.c
# Opt level: O3

err_t bign96Verify(bign_params *params,octet *oid_der,size_t oid_len,octet *hash,octet *sig,
                  octet *pubkey)

{
  u64 *dest;
  u64 *stack;
  bool_t bVar1;
  err_t eVar2;
  int iVar3;
  size_t sVar4;
  ec_o *ec;
  u64 *dest_00;
  word *b;
  
  bVar1 = memIsValid(params,0x150);
  if (bVar1 == 0) {
    eVar2 = 0x6d;
  }
  else {
    eVar2 = 0x1f6;
    if (((params->l == 0x60) && (eVar2 = 0x12d, oid_len != 0xffffffffffffffff)) &&
       (sVar4 = oidFromDER((char *)0x0,oid_der,oid_len), sVar4 != 0xffffffffffffffff)) {
      sVar4 = bign96Start_keep(bign96Verify_deep);
      ec = (ec_o *)blobCreate(sVar4);
      if (ec == (ec_o *)0x0) {
        eVar2 = 0x6e;
      }
      else {
        eVar2 = bign96Start(ec,params);
        if (eVar2 == 0) {
          sVar4 = ec->f->n;
          bVar1 = memIsValid(hash,0x18);
          eVar2 = 0x6d;
          if (((bVar1 != 0) && (bVar1 = memIsValid(sig,0x22), bVar1 != 0)) &&
             (bVar1 = memIsValid(pubkey,0x30), bVar1 != 0)) {
            b = (word *)((long)&(ec->hdr).keep + (ec->hdr).keep);
            dest_00 = b + sVar4 * 2;
            dest = dest_00 + sVar4;
            stack = dest + sVar4;
            bVar1 = (*ec->f->from)(b,pubkey,ec->f,stack);
            eVar2 = 0x1f9;
            if ((bVar1 != 0) &&
               (bVar1 = (*ec->f->from)(b + sVar4,pubkey + 0x18,ec->f,stack), bVar1 != 0)) {
              u64From(dest,sig + 10,0x18);
              iVar3 = wwCmp(dest,ec->order,sVar4);
              eVar2 = 0x1fe;
              if (iVar3 < 0) {
                u64From(dest_00,hash,0x18);
                iVar3 = wwCmp(dest_00,ec->order,sVar4);
                if (-1 < iVar3) {
                  zzSub2(dest_00,ec->order,sVar4);
                }
                zzAddMod(dest,dest,dest_00,ec->order,sVar4);
                memCopy(dest_00,sig,10);
                *(undefined2 *)((long)dest_00 + 10) = 0;
                *(undefined1 *)((long)dest_00 + 0xc) = 0x80;
                u64From(dest_00,dest_00,0xd);
                bVar1 = ecAddMulA(b,ec,stack,2,ec->base,dest,sVar4,b,dest_00,2);
                if (bVar1 != 0) {
                  (*ec->f->to)((octet *)b,b,ec->f,stack);
                  beltHashStart(stack);
                  beltHashStepH(oid_der,oid_len,stack);
                  beltHashStepH(b,0x18,stack);
                  beltHashStepH(hash,0x18,stack);
                  bVar1 = beltHashStepV2(sig,10,stack);
                  eVar2 = 0;
                  if (bVar1 == 0) {
                    eVar2 = 0x1fe;
                  }
                }
              }
            }
          }
        }
        blobClose(ec);
      }
    }
  }
  return eVar2;
}

Assistant:

err_t bign96Verify(const bign_params* params, const octet oid_der[],
	size_t oid_len, const octet hash[24], const octet sig[34],
	const octet pubkey[48])
{
	err_t code;
	size_t n;
	// состояние (буферы могут пересекаться)
	void* state;
	ec_o* ec;			/* описание эллиптической кривой */	
	word* Q;			/* [2n] открытый ключ */
	word* R;			/* [2n] точка R */
	word* H;			/* [n] хэш-значение */
	word* s0;			/* [W_OF_O(13)] первая часть подписи */
	word* s1;			/* [n] вторая часть подписи */
	octet* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (params->l != 96)
		return ERR_BAD_PARAMS;
	// проверить oid_der
	if (oid_len == SIZE_MAX || oidFromDER(0, oid_der, oid_len)  == SIZE_MAX)
		return ERR_BAD_OID;
	// создать состояние
	state = blobCreate(bign96Start_keep(bign96Verify_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bign96Start(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	n = ec->f->n;
	// проверить входные указатели
	if (!memIsValid(hash, 24) ||
		!memIsValid(sig, 34) ||
		!memIsValid(pubkey, 48))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	Q = R = objEnd(ec, word);
	H = s0 = Q + 2 * n;
	s1 = H + n;
	stack = (octet*)(s1 + n);
	// загрузить Q
	if (!qrFrom(ecX(Q), pubkey, ec->f, stack) ||
		!qrFrom(ecY(Q, n), pubkey + 24, ec->f, stack))
	{
		blobClose(state);
		return ERR_BAD_PUBKEY;
	}
	// загрузить и проверить s1
	wwFrom(s1, sig + 10, 24);
	if (wwCmp(s1, ec->order, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_SIG;
	}
	// s1 <- (s1 + H) mod q
	wwFrom(H, hash, 24);
	if (wwCmp(H, ec->order, n) >= 0)
	{
		zzSub2(H, ec->order, n);
		// 2^{l - 1} < q < 2^l, H < 2^l => H - q < q
		ASSERT(wwCmp(H, ec->order, n) < 0);
	}
	zzAddMod(s1, s1, H, ec->order, n);
	// загрузить s0
	memCopy(s0, sig, 10);
	((octet*)s0)[10] = ((octet*)s0)[11] = 0, ((octet*)s0)[12] = 0x80;
	wwFrom(s0, s0, 13);
	// R <- s1 G + (s0 + 2^l) Q
	if (!ecAddMulA(R, ec, stack, 2, ec->base, s1, n, Q, s0, (size_t)W_OF_O(13)))
	{
		blobClose(state);
		return ERR_BAD_SIG;
	}
	qrTo((octet*)R, ecX(R), ec->f, stack);
	// s0 == belt-hash(oid || R || H) mod 2^80?
	beltHashStart(stack);
	beltHashStepH(oid_der, oid_len, stack);
	beltHashStepH(R, 24, stack);
	beltHashStepH(hash, 24, stack);
	code = beltHashStepV2(sig, 10, stack) ? ERR_OK : ERR_BAD_SIG;
	// завершение
	blobClose(state);
	return code;
}